

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function_test.cc
# Opt level: O3

void __thiscall xLearn::SCORE_TEST_Create_Score_Test::TestBody(SCORE_TEST_Create_Score_Test *this)

{
  bool bVar1;
  Score *pSVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  string local_28;
  
  pSVar2 = CreateScore("linear");
  local_38[0] = (internal)(pSVar2 != (Score *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pSVar2 == (Score *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"CreateScore(\"linear\") != NULL","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x20,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pSVar2 = CreateScore("fm");
  local_38[0] = (internal)(pSVar2 != (Score *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pSVar2 == (Score *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"CreateScore(\"fm\") != NULL","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x21,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pSVar2 = CreateScore("ffm");
  local_38[0] = (internal)(pSVar2 != (Score *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pSVar2 == (Score *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"CreateScore(\"ffm\") != NULL","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x22,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pSVar2 = CreateScore("");
  local_38[0] = (internal)(pSVar2 == (Score *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_38[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"CreateScore(\"\") == NULL","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x23,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pSVar2 = CreateScore("unknow_name");
  local_38[0] = (internal)(pSVar2 == (Score *)0x0);
  local_30.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_38[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_38,(AssertionResult *)"CreateScore(\"unknow_name\") == NULL","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/score_function_test.cc"
               ,0x24,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SCORE_TEST, Create_Score) {
  EXPECT_TRUE(CreateScore("linear") != NULL);
  EXPECT_TRUE(CreateScore("fm") != NULL);
  EXPECT_TRUE(CreateScore("ffm") != NULL);
  EXPECT_TRUE(CreateScore("") == NULL);
  EXPECT_TRUE(CreateScore("unknow_name") == NULL);
}